

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-automation.cpp
# Opt level: O0

void test_basic_learn(void)

{
  Dummy d;
  AutomationMgr mgr;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  AutomationMgr *this;
  char *b;
  AutomationMgr *in_stack_ffffffffffffff80;
  anon_class_8_1_54a39804 *in_stack_ffffffffffffff88;
  function<void_(const_char_*)> *this_00;
  AutomationMgr *in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  AutomationMgr *in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffdf;
  _Invoker_type in_stack_ffffffffffffffe0;
  int in_stack_ffffffffffffffec;
  AutomationMgr *in_stack_fffffffffffffff0;
  
  suite((char *)0x104473);
  this = (AutomationMgr *)&stack0xffffffffffffff98;
  rtosc::AutomationMgr::AutomationMgr
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb4);
  this_00 = (function<void_(const_char_*)> *)0x0;
  rtosc::AutomationMgr::set_ports(this,&p);
  rtosc::AutomationMgr::set_instance
            ((AutomationMgr *)&stack0xffffffffffffff98,&stack0xffffffffffffff90);
  rtosc::AutomationMgr::createBinding
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,(char *)in_stack_ffffffffffffffe0,
             (bool)in_stack_ffffffffffffffdf);
  b = &stack0xffffffffffffff90;
  std::function<void(char_const*)>::operator=(this_00,in_stack_ffffffffffffff88);
  assert_str_eq((char *)in_stack_ffffffffffffff80,b,(char *)this,in_stack_ffffffffffffff6c);
  assert_flt_eq((float)((ulong)this >> 0x20),SUB84(this,0),
                (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
  rtosc::AutomationMgr::setSlot(in_stack_ffffffffffffff80,(int)((ulong)b >> 0x20),SUB84(b,0));
  assert_flt_eq((float)((ulong)this >> 0x20),SUB84(this,0),
                (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
  rtosc::AutomationMgr::setSlot(in_stack_ffffffffffffff80,(int)((ulong)b >> 0x20),SUB84(b,0));
  assert_flt_eq((float)((ulong)this >> 0x20),SUB84(this,0),
                (char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),0);
  rtosc::AutomationMgr::~AutomationMgr(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

void test_basic_learn(void)
{
    suite("test_basic_learn");
    rtosc::AutomationMgr mgr(4, 2, 16);
    Dummy d = {0,0};
    mgr.set_ports(p);
    mgr.set_instance(&d);
    mgr.createBinding(0, "/foo", false);
    mgr.backend = [&d](const char *msg) {
        rtosc::RtData rd;
        char loc[128];
        rd.loc = loc;
        rd.loc_size = sizeof(loc);
        rd.obj = &d; p.dispatch(msg, rd, true);};
    assert_str_eq("/foo", mgr.slots[0].automations[0].param_path, "Parameter is learned", __LINE__);
    assert_flt_eq(0, d.foo, "Learning does not change values", __LINE__);
    mgr.setSlot(0, 1);
    assert_flt_eq(10, d.foo, "Slot to max makes bound parameter max", __LINE__);
    mgr.setSlot(0, 0);
    assert_flt_eq(-1, d.foo, "Slot to min makes bound parameter min", __LINE__);
}